

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall higan::FileForRead::FileForRead(FileForRead *this,string *file_path)

{
  int iVar1;
  char *pcVar2;
  string *file_path_local;
  FileForRead *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)file_path);
  (this->file_stat_).__glibc_reserved[1] = 0;
  (this->file_stat_).__glibc_reserved[2] = 0;
  (this->file_stat_).st_ctim.tv_nsec = 0;
  (this->file_stat_).__glibc_reserved[0] = 0;
  (this->file_stat_).st_mtim.tv_nsec = 0;
  (this->file_stat_).st_ctim.tv_sec = 0;
  (this->file_stat_).st_atim.tv_nsec = 0;
  (this->file_stat_).st_mtim.tv_sec = 0;
  (this->file_stat_).st_blocks = 0;
  (this->file_stat_).st_atim.tv_sec = 0;
  (this->file_stat_).st_size = 0;
  (this->file_stat_).st_blksize = 0;
  (this->file_stat_).st_gid = 0;
  (this->file_stat_).__pad0 = 0;
  (this->file_stat_).st_rdev = 0;
  (this->file_stat_).st_nlink = 0;
  (this->file_stat_).st_mode = 0;
  (this->file_stat_).st_uid = 0;
  (this->file_stat_).st_dev = 0;
  (this->file_stat_).st_ino = 0;
  this->file_status_ = NOT_EXIST;
  this->read_fd_ = -1;
  Buffer::Buffer(&this->cache_buffer_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,(stat *)&this->file_stat_);
  if (iVar1 == 0) {
    if (((this->file_stat_).st_mode & 0xf000) == 0x4000) {
      this->file_status_ = IS_DIR;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = open(pcVar2,0x80000);
      this->read_fd_ = iVar1;
      if (this->read_fd_ == -1) {
        this->file_status_ = OPEN_ERROR;
      }
      else {
        this->file_status_ = OPEN_SUCCESS;
      }
    }
  }
  return;
}

Assistant:

FileForRead::FileForRead(const std::string& file_path):
		file_path_(file_path),
		file_stat_(),
		file_status_(FileStatus::NOT_EXIST),
		read_fd_(-1),
		cache_buffer_()
{
	if (stat(file_path_.c_str(), &file_stat_) == 0)
	{

		if (S_ISDIR(file_stat_.st_mode))
		{
			file_status_ = FileStatus::IS_DIR;
		}
		else
		{
			read_fd_ = open(file_path_.c_str(), O_RDONLY | O_CLOEXEC);
			if (read_fd_ == -1)
			{
				file_status_ = FileStatus::OPEN_ERROR;
			}
			else
			{
				file_status_ = FileStatus::OPEN_SUCCESS;
			}
		}
	}
}